

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

void evmap_io_active_(event_base *base,int fd,short events)

{
  undefined8 *puVar1;
  event *local_30;
  event *ev;
  evmap_io *ctx;
  event_signal_map *io;
  short events_local;
  int fd_local;
  event_base *base_local;
  
  if (((-1 < fd) && (fd < (base->io).nentries)) &&
     (puVar1 = (undefined8 *)(base->io).entries[fd], puVar1 != (undefined8 *)0x0)) {
    for (local_30 = (event *)*puVar1; local_30 != (event *)0x0;
        local_30 = (local_30->ev_).ev_io.ev_io_next.le_next) {
      if ((ushort)(local_30->ev_events & events) != 0) {
        event_active_nolock_(local_30,(int)(short)(local_30->ev_events & events),1);
      }
    }
  }
  return;
}

Assistant:

void
evmap_io_active_(struct event_base *base, evutil_socket_t fd, short events)
{
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx;
	struct event *ev;

#ifndef EVMAP_USE_HT
	if (fd < 0 || fd >= io->nentries)
		return;
#endif
	GET_IO_SLOT(ctx, io, fd, evmap_io);

	if (NULL == ctx)
		return;
	LIST_FOREACH(ev, &ctx->events, ev_io_next) {
		if (ev->ev_events & events)
			event_active_nolock_(ev, ev->ev_events & events, 1);
	}
}